

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strand_service.hpp
# Opt level: O3

void __thiscall
asio::detail::strand_service::
dispatch<asio::detail::binder1<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::function<void(std::error_code_const&)>,std::error_code_const&)>,std::error_code>>
          (strand_service *this,implementation_type *impl,
          binder1<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_std::error_code>
          *handler)

{
  io_context_impl *owner;
  error_category *peVar1;
  undefined4 uVar2;
  bool bVar3;
  long *plVar4;
  completion_handler<asio::detail::binder1<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_std::error_code>_>
  *op;
  undefined8 uVar5;
  long in_FS_OFFSET;
  on_dispatch_exit on_exit;
  context ctx;
  on_dispatch_exit local_70;
  ptr local_60;
  implementation_type local_48;
  implementation_type *local_40;
  undefined8 local_38;
  error_code local_30;
  
  plVar4 = *(long **)(in_FS_OFFSET + -8);
  if (plVar4 != (long *)0x0) {
    do {
      if ((implementation_type)*plVar4 == *impl) {
        if (plVar4[1] != 0) {
          std::
          __invoke_impl<void,void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*&)(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::function<void(std::error_code_const&)>,std::error_code_const&),std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>&,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>&,std::function<void(std::error_code_const&)>&,std::error_code_const&>
                    (handler,&(handler->handler_)._M_bound_args.
                              super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>_>
                              .
                              super__Head_base<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_false>
                     ,&(handler->handler_)._M_bound_args.
                       super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>_>
                       .
                       super__Tuple_impl<1UL,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>_>
                       .
                       super__Head_base<1UL,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_false>
                     ,&(handler->handler_)._M_bound_args,&handler->arg1_);
          return;
        }
        break;
      }
      plVar4 = (long *)plVar4[2];
    } while (plVar4 != (long *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -0x10) + 8);
  }
  local_60.h = handler;
  op = (completion_handler<asio::detail::binder1<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_std::error_code>_>
        *)thread_info_base::allocate<asio::detail::thread_info_base::default_tag>(uVar5,0x78);
  (op->super_operation).next_ = (scheduler_operation *)0x0;
  (op->super_operation).func_ =
       completion_handler<asio::detail::binder1<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_std::error_code>_>
       ::do_complete;
  (op->super_operation).task_result_ = 0;
  uVar5 = *(undefined8 *)&(handler->handler_).field_0x8;
  (op->handler_).handler_._M_f = (handler->handler_)._M_f;
  *(undefined8 *)&(op->handler_).handler_.field_0x8 = uVar5;
  local_60.v = op;
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>_>
  ::_Tuple_impl(&(op->handler_).handler_._M_bound_args.
                 super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>_>
                ,&(handler->handler_)._M_bound_args.
                  super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>_>
               );
  uVar2 = *(undefined4 *)&(handler->arg1_).field_0x4;
  peVar1 = (handler->arg1_)._M_cat;
  (op->handler_).arg1_._M_value = (handler->arg1_)._M_value;
  *(undefined4 *)&(op->handler_).arg1_.field_0x4 = uVar2;
  (op->handler_).arg1_._M_cat = peVar1;
  local_60.p = op;
  bVar3 = do_dispatch(this,impl,(operation *)op);
  local_60.v = (completion_handler<asio::detail::binder1<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_std::error_code>_>
                *)0x0;
  local_60.p = (completion_handler<asio::detail::binder1<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_std::error_code>_>
                *)0x0;
  if (bVar3) {
    local_48 = *impl;
    local_38 = *(undefined8 *)(in_FS_OFFSET + -8);
    local_40 = &local_48;
    *(implementation_type **)(in_FS_OFFSET + -8) = local_40;
    owner = this->io_context_;
    local_70.impl_ = *impl;
    local_30._M_value = 0;
    local_70.io_context_ = owner;
    local_30._M_cat = (error_category *)std::_V2::system_category();
    completion_handler<asio::detail::binder1<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_std::error_code>_>
    ::do_complete(owner,(operation *)op,&local_30,0);
    on_dispatch_exit::~on_dispatch_exit(&local_70);
    *(undefined8 *)(in_FS_OFFSET + -8) = local_38;
  }
  completion_handler<asio::detail::binder1<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_std::error_code>_>
  ::ptr::reset(&local_60);
  return;
}

Assistant:

void strand_service::dispatch(strand_service::implementation_type& impl,
    Handler& handler)
{
  // If we are already in the strand then the handler can run immediately.
  if (call_stack<strand_impl>::contains(impl))
  {
    fenced_block b(fenced_block::full);
    asio_handler_invoke_helpers::invoke(handler, handler);
    return;
  }

  // Allocate and construct an operation to wrap the handler.
  typedef completion_handler<Handler> op;
  typename op::ptr p = { asio::detail::addressof(handler),
    op::ptr::allocate(handler), 0 };
  p.p = new (p.v) op(handler);

  ASIO_HANDLER_CREATION((this->context(),
        *p.p, "strand", impl, 0, "dispatch"));

  bool dispatch_immediately = do_dispatch(impl, p.p);
  operation* o = p.p;
  p.v = p.p = 0;

  if (dispatch_immediately)
  {
    // Indicate that this strand is executing on the current thread.
    call_stack<strand_impl>::context ctx(impl);

    // Ensure the next handler, if any, is scheduled on block exit.
    on_dispatch_exit on_exit = { &io_context_, impl };
    (void)on_exit;

    completion_handler<Handler>::do_complete(
        &io_context_, o, asio::error_code(), 0);
  }
}